

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

int nghttp2_frame_pack_goaway(nghttp2_bufs *bufs,nghttp2_goaway *frame)

{
  nghttp2_buf_chain *pnVar1;
  nghttp2_buf *buf;
  int rv;
  nghttp2_goaway *frame_local;
  nghttp2_bufs *bufs_local;
  
  if (bufs->head != bufs->cur) {
    __assert_fail("bufs->head == bufs->cur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                  ,0x278,"int nghttp2_frame_pack_goaway(nghttp2_bufs *, nghttp2_goaway *)");
  }
  pnVar1 = bufs->head;
  (pnVar1->buf).pos = (pnVar1->buf).pos + -9;
  nghttp2_frame_pack_frame_hd((pnVar1->buf).pos,&frame->hd);
  nghttp2_put_uint32be((pnVar1->buf).last,frame->last_stream_id);
  (pnVar1->buf).last = (pnVar1->buf).last + 4;
  nghttp2_put_uint32be((pnVar1->buf).last,frame->error_code);
  (pnVar1->buf).last = (pnVar1->buf).last + 4;
  bufs_local._4_4_ = nghttp2_bufs_add(bufs,frame->opaque_data,frame->opaque_data_len);
  if (bufs_local._4_4_ == -0x1f6) {
    bufs_local._4_4_ = -0x20a;
  }
  else if (bufs_local._4_4_ == 0) {
    bufs_local._4_4_ = 0;
  }
  return bufs_local._4_4_;
}

Assistant:

int nghttp2_frame_pack_goaway(nghttp2_bufs *bufs, nghttp2_goaway *frame) {
  int rv;
  nghttp2_buf *buf;

  assert(bufs->head == bufs->cur);

  buf = &bufs->head->buf;

  buf->pos -= NGHTTP2_FRAME_HDLEN;

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  nghttp2_put_uint32be(buf->last, (uint32_t)frame->last_stream_id);
  buf->last += 4;

  nghttp2_put_uint32be(buf->last, frame->error_code);
  buf->last += 4;

  rv = nghttp2_bufs_add(bufs, frame->opaque_data, frame->opaque_data_len);

  if (rv == NGHTTP2_ERR_BUFFER_ERROR) {
    return NGHTTP2_ERR_FRAME_SIZE_ERROR;
  }

  if (rv != 0) {
    return rv;
  }

  return 0;
}